

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

_Bool isip(char *domain)

{
  int iVar1;
  _Bool _Var2;
  in_addr addr;
  in6_addr addr6;
  undefined1 local_1c [4];
  undefined1 local_18 [16];
  
  iVar1 = inet_pton(2,domain,local_1c);
  _Var2 = true;
  if (iVar1 == 0) {
    iVar1 = inet_pton(10,domain,local_18);
    _Var2 = iVar1 != 0;
  }
  return _Var2;
}

Assistant:

static bool isip(const char *domain)
{
  struct in_addr addr;
#ifdef ENABLE_IPV6
  struct in6_addr addr6;
#endif

  if(Curl_inet_pton(AF_INET, domain, &addr)
#ifdef ENABLE_IPV6
     || Curl_inet_pton(AF_INET6, domain, &addr6)
#endif
    ) {
    /* domain name given as IP address */
    return TRUE;
  }

  return FALSE;
}